

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSortSpecsSanitize(ImGuiTable *table)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ImGuiTableColumn *pIVar4;
  ulong uVar5;
  int iVar6;
  ImGuiTableColumn *p_1;
  ImGuiTableColumn *pIVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ImGuiTableColumn *p;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  uVar2 = table->Flags;
  if ((uVar2 & 8) == 0) {
    __assert_fail("table->Flags & ImGuiTableFlags_Sortable",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                  ,0xa82,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
  }
  uVar3 = table->ColumnsCount;
  uVar5 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    iVar6 = 0;
    lVar10 = 1;
  }
  else {
    pIVar7 = (table->Columns).Data;
    iVar6 = 0;
    uVar9 = 0;
    uVar12 = uVar5;
    do {
      if ((table->Columns).DataEnd <= pIVar7) goto LAB_00172617;
      if ((long)pIVar7->SortOrder != 0xffffffffffffffff) {
        if (pIVar7->IsEnabled == false) {
          pIVar7->SortOrder = -1;
        }
        else {
          if (0x3e < iVar6) {
            __assert_fail("sort_order_count < (int)sizeof(sort_order_mask) * 8",
                          "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                          ,0xa90,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
          }
          iVar6 = iVar6 + 1;
          uVar9 = uVar9 | 1L << ((long)pIVar7->SortOrder & 0x3fU);
        }
      }
      pIVar7 = pIVar7 + 1;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
    lVar10 = uVar9 + 1;
  }
  bVar14 = (uVar2 >> 0x1a & 1) == 0;
  if (0 < iVar6 && (bVar14 && 1 < iVar6 || 1L << ((byte)iVar6 & 0x3f) != lVar10)) {
    iVar8 = 0;
    uVar12 = 0;
    do {
      if ((int)uVar3 < 1) {
LAB_00172636:
        __assert_fail("column_with_smallest_sort_order != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                      ,0xaa1,"void ImGui::TableSortSpecsSanitize(ImGuiTable *)");
      }
      uVar13 = 0xffffffff;
      lVar10 = 0x56;
      uVar9 = 0;
      do {
        if ((uVar12 >> (uVar9 & 0x3f) & 1) == 0) {
          pIVar7 = (table->Columns).Data;
          pIVar4 = (table->Columns).DataEnd;
          if (pIVar4 <= (ImGuiTableColumn *)((long)pIVar7 + lVar10 + -0x56)) goto LAB_00172617;
          cVar1 = *(char *)((long)&pIVar7->Flags + lVar10);
          if (cVar1 != -1) {
            iVar11 = (int)uVar13;
            if (iVar11 != -1) {
              if ((iVar11 < 0) || (pIVar4 <= pIVar7 + iVar11)) goto LAB_00172617;
              if (pIVar7[iVar11].SortOrder <= cVar1) goto LAB_00172522;
            }
            uVar13 = uVar9 & 0xffffffff;
          }
        }
LAB_00172522:
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 0x68;
      } while (uVar5 != uVar9);
      iVar11 = (int)uVar13;
      if (iVar11 == -1) goto LAB_00172636;
      if (iVar11 < 0) goto LAB_00172617;
      pIVar7 = (table->Columns).Data;
      if ((table->Columns).DataEnd <= pIVar7 + iVar11) goto LAB_00172617;
      pIVar7[iVar11].SortOrder = (ImGuiTableColumnIdx)iVar8;
      if (bVar14 && 1 < iVar6) {
        iVar6 = 1;
        if ((int)uVar3 < 1) goto LAB_00172608;
        lVar10 = 0;
        goto LAB_001725c7;
      }
      uVar12 = uVar12 | 1L << (uVar13 & 0x3f);
      iVar8 = iVar8 + 1;
    } while (iVar8 < iVar6);
  }
  if ((iVar6 == 0) && (iVar6 = 0, ((byte)(uVar2 >> 0x1b) & 1) == 0 && 0 < (int)uVar3)) {
    pIVar7 = (table->Columns).Data;
    do {
      if ((table->Columns).DataEnd <= pIVar7) {
LAB_00172617:
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_internal.h"
                      ,0x24a,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
      }
      if ((pIVar7->IsEnabled == true) && ((pIVar7->Flags & 0x200) == 0)) {
        pIVar7->SortOrder = '\0';
        if ((pIVar7->field_0x65 & 0xc) == 0) {
          __assert_fail("n < column->SortDirectionsAvailCount",
                        "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                        ,0xa40,
                        "ImGuiSortDirection TableGetColumnAvailSortDirection(ImGuiTableColumn *, int)"
                       );
        }
        pIVar7->field_0x65 = pIVar7->field_0x65 & 0xfc | pIVar7->SortDirectionsAvailList & 3;
        iVar6 = 1;
        break;
      }
      pIVar7 = pIVar7 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
LAB_00172608:
  table->SortSpecsCount = (ImGuiTableColumnIdx)iVar6;
  return;
LAB_001725c7:
  do {
    if (uVar13 * 0x68 - lVar10 != 0) {
      if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&pIVar7->Flags + lVar10))
      goto LAB_00172617;
      (&pIVar7->SortOrder)[lVar10] = -1;
    }
    lVar10 = lVar10 + 0x68;
  } while (uVar5 * 0x68 - lVar10 != 0);
  goto LAB_00172608;
}

Assistant:

void ImGui::TableSortSpecsSanitize(ImGuiTable* table)
{
    IM_ASSERT(table->Flags & ImGuiTableFlags_Sortable);

    // Clear SortOrder from hidden column and verify that there's no gap or duplicate.
    int sort_order_count = 0;
    ImU64 sort_order_mask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder != -1 && !column->IsEnabled)
            column->SortOrder = -1;
        if (column->SortOrder == -1)
            continue;
        sort_order_count++;
        sort_order_mask |= ((ImU64)1 << column->SortOrder);
        IM_ASSERT(sort_order_count < (int)sizeof(sort_order_mask) * 8);
    }

    const bool need_fix_linearize = ((ImU64)1 << sort_order_count) != (sort_order_mask + 1);
    const bool need_fix_single_sort_order = (sort_order_count > 1) && !(table->Flags & ImGuiTableFlags_SortMulti);
    if (need_fix_linearize || need_fix_single_sort_order)
    {
        ImU64 fixed_mask = 0x00;
        for (int sort_n = 0; sort_n < sort_order_count; sort_n++)
        {
            // Fix: Rewrite sort order fields if needed so they have no gap or duplicate.
            // (e.g. SortOrder 0 disappeared, SortOrder 1..2 exists --> rewrite then as SortOrder 0..1)
            int column_with_smallest_sort_order = -1;
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                if ((fixed_mask & ((ImU64)1 << (ImU64)column_n)) == 0 && table->Columns[column_n].SortOrder != -1)
                    if (column_with_smallest_sort_order == -1 || table->Columns[column_n].SortOrder < table->Columns[column_with_smallest_sort_order].SortOrder)
                        column_with_smallest_sort_order = column_n;
            IM_ASSERT(column_with_smallest_sort_order != -1);
            fixed_mask |= ((ImU64)1 << column_with_smallest_sort_order);
            table->Columns[column_with_smallest_sort_order].SortOrder = (ImGuiTableColumnIdx)sort_n;

            // Fix: Make sure only one column has a SortOrder if ImGuiTableFlags_MultiSortable is not set.
            if (need_fix_single_sort_order)
            {
                sort_order_count = 1;
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                    if (column_n != column_with_smallest_sort_order)
                        table->Columns[column_n].SortOrder = -1;
                break;
            }
        }
    }

    // Fallback default sort order (if no column had the ImGuiTableColumnFlags_DefaultSort flag)
    if (sort_order_count == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_NoSort))
            {
                sort_order_count = 1;
                column->SortOrder = 0;
                column->SortDirection = (ImU8)TableGetColumnAvailSortDirection(column, 0);
                break;
            }
        }

    table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_count;
}